

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86.cpp
# Opt level: O0

int __thiscall ncnn::Convolution1D_x86::create_pipeline(Convolution1D_x86 *this,Option *opt)

{
  ulong uVar1;
  int iVar2;
  float *pfVar3;
  long in_RSI;
  Mat *in_RDI;
  float *k00;
  int j;
  int i;
  int k;
  float *g00;
  int p;
  Mat g0;
  int q;
  Mat weight_data_r2;
  int out_elempack;
  int elempack;
  int num_input;
  undefined8 in_stack_fffffffffffffea0;
  int _elempack;
  size_t in_stack_fffffffffffffea8;
  Mat *in_stack_fffffffffffffec8;
  Allocator *in_stack_fffffffffffffed0;
  int local_e4;
  int local_e0;
  int local_dc;
  float *local_d8;
  int local_cc;
  Allocator *in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff4c;
  int in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  Mat *in_stack_ffffffffffffff58;
  int local_80;
  int local_24;
  int local_20;
  
  _elempack = (int)((ulong)in_stack_fffffffffffffea0 >> 0x20);
  if (*(int *)((long)&in_RDI[4].allocator + *(long *)((long)in_RDI->data + -0x18)) == 0) {
    uVar1 = (long)*(int *)((long)&in_RDI[3].elempack + *(long *)((long)in_RDI->data + -0x18)) /
            (long)*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4);
    iVar2 = (int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) /
                 (long)*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)));
    local_20 = 1;
    local_24 = 1;
    if ((*(byte *)(in_RSI + 0x27) & 1) != 0) {
      local_20 = 1;
      if (iVar2 % 4 == 0) {
        local_20 = 4;
      }
      local_24 = 1;
      if (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)) % 4 == 0) {
        local_24 = 4;
      }
    }
    ncnn::Mat::reshape(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,in_stack_ffffffffffffff50
                       ,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff40);
    ncnn::Mat::create(in_RDI,local_24,iVar2 / local_20,
                      *(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)),
                      in_stack_fffffffffffffea8,_elempack,in_stack_fffffffffffffed0);
    for (local_80 = 0;
        local_80 + local_24 + -1 <
        *(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18));
        local_80 = local_24 + local_80) {
      ncnn::Mat::channel(in_stack_fffffffffffffec8,(int)((ulong)in_RDI >> 0x20));
      for (local_cc = 0; local_cc + local_20 + -1 < iVar2; local_cc = local_20 + local_cc) {
        local_d8 = ncnn::Mat::row((Mat *)&stack0xffffffffffffff38,local_cc / local_20);
        for (local_dc = 0;
            local_dc < *(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4);
            local_dc = local_dc + 1) {
          for (local_e0 = 0; local_e0 < local_20; local_e0 = local_e0 + 1) {
            for (local_e4 = 0; local_e4 < local_24; local_e4 = local_e4 + 1) {
              ncnn::Mat::channel(in_stack_fffffffffffffec8,(int)((ulong)in_RDI >> 0x20));
              pfVar3 = ncnn::Mat::row((Mat *)&stack0xfffffffffffffec8,local_cc + local_e0);
              ncnn::Mat::~Mat((Mat *)0x90d25e);
              *local_d8 = pfVar3[local_dc];
              local_d8 = local_d8 + 1;
            }
          }
        }
      }
      ncnn::Mat::~Mat((Mat *)0x90d35b);
    }
    ncnn::Mat::~Mat((Mat *)0x90d391);
  }
  return 0;
}

Assistant:

int Convolution1D_x86::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    int num_input = weight_data_size / kernel_w / num_output;

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // src = kw-inch-outch
    // dst = pb-pa-kw-inch/pa-outch/pb
    {
        Mat weight_data_r2 = weight_data.reshape(kernel_w, num_input, num_output);

        weight_data_packed.create(kernel_w, num_input / elempack, num_output / out_elempack, (size_t)4u * elempack * out_elempack, elempack * out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            Mat g0 = weight_data_packed.channel(q / out_elempack);

            for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
            {
                float* g00 = g0.row(p / elempack);

                for (int k = 0; k < kernel_w; k++)
                {
                    for (int i = 0; i < elempack; i++)
                    {
                        for (int j = 0; j < out_elempack; j++)
                        {
                            const float* k00 = weight_data_r2.channel(q + j).row(p + i);

                            g00[0] = k00[k];

                            g00++;
                        }
                    }
                }
            }
        }
    }

    return 0;
}